

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall
Kernel::NonVariableIterator::NonVariableIterator
          (NonVariableIterator *this,Term *term,bool includeSelf)

{
  byte in_DL;
  Stack<Kernel::Term_*> *in_RDI;
  Term *in_stack_ffffffffffffffb8;
  Stack<Kernel::Term_*> *in_stack_ffffffffffffffd0;
  NonVariableIterator *in_stack_ffffffffffffffd8;
  
  Lib::IteratorCore<Kernel::TermList>::IteratorCore((IteratorCore<Kernel::TermList> *)in_RDI);
  in_RDI->_capacity = (size_t)&PTR__NonVariableIterator_013206c8;
  Lib::Stack<Kernel::Term_*>::Stack(in_stack_ffffffffffffffd0,(size_t)&in_RDI->_cursor);
  *(undefined4 *)&in_RDI[1]._cursor = 0;
  Lib::Stack<Kernel::Term_*>::push(in_RDI,in_stack_ffffffffffffffb8);
  if ((in_DL & 1) == 0) {
    next(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

NonVariableIterator(Term* term,bool includeSelf=false)
  : _stack(8),
    _added(0)
  {
    _stack.push(term);
    if (!includeSelf) {
      NonVariableIterator::next();
    }
  }